

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dws.cpp
# Opt level: O0

string * readLine_abi_cxx11_(string *__return_storage_ptr__,Stream *stream)

{
  char local_19;
  Stream *pSStack_18;
  char c;
  Stream *stream_local;
  string *line;
  
  pSStack_18 = stream;
  stream_local = (Stream *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  do {
    (**(code **)(*(long *)pSStack_18 + 0x20))(pSStack_18,&local_19,1);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_19);
  } while (local_19 != '\n');
  return __return_storage_ptr__;
}

Assistant:

string readLine(Stream* stream)
{
	char c;
	string line;
	do
	{
		stream->read(&c, 1);
		line += c;
	} while (c != '\n');
	return line;
}